

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrshift~.c
# Opt level: O1

void lrshift_tilde_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("lrshift~");
  lrshift_tilde_class = class_new(ptVar1,lrshift_tilde_new,(t_method)0x0,0x38,0,A_DEFFLOAT,0);
  class_domainsignalin(lrshift_tilde_class,0x34);
  c = lrshift_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(c,lrshift_tilde_dsp,ptVar1,A_NULL);
  return;
}

Assistant:

void lrshift_tilde_setup(void)
{
    lrshift_tilde_class = class_new(gensym("lrshift~"),
        (t_newmethod)lrshift_tilde_new, 0, sizeof(t_lrshift_tilde), 0, 
            A_DEFFLOAT, 0);
    CLASS_MAINSIGNALIN(lrshift_tilde_class, t_lrshift_tilde, x_f);
    class_addmethod(lrshift_tilde_class, (t_method)lrshift_tilde_dsp,
        gensym("dsp"), 0);
}